

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview_p.h
# Opt level: O0

void __thiscall
QAbstractItemViewPrivate::paintDropIndicator(QAbstractItemViewPrivate *this,QPainter *painter)

{
  bool bVar1;
  int iVar2;
  QStyle *pQVar3;
  QAbstractItemView *pQVar4;
  QStyleOption *in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QStyleOption opt;
  QWidget *in_stack_ffffffffffffff78;
  QRect *in_stack_ffffffffffffff80;
  uint6 in_stack_ffffffffffffff98;
  bool bVar5;
  undefined1 uVar6;
  byte bVar7;
  QCursor local_50;
  undefined1 local_48 [16];
  undefined8 local_38;
  undefined8 local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar7 = 0;
  bVar5 = false;
  if (((in_RDI->showDropIndicator & 1U) != 0) && (bVar5 = false, in_RDI->state == DraggingState)) {
    bVar1 = QRect::isNull(in_stack_ffffffffffffff80);
    bVar5 = false;
    if (!bVar1) {
      QWidget::cursor((QWidget *)CONCAT17(bVar7,(uint7)in_stack_ffffffffffffff98));
      bVar7 = 1;
      iVar2 = QCursor::shape();
      bVar5 = iVar2 != 0xe;
    }
  }
  uVar6 = bVar5;
  if ((bVar7 & 1) != 0) {
    QCursor::~QCursor(&local_50);
  }
  if (bVar5 != false) {
    memset(local_48,0xaa,0x40);
    QStyleOption::QStyleOption
              ((QStyleOption *)CONCAT17(bVar7,CONCAT16(uVar6,in_stack_ffffffffffffff98)),
               (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    q_func(in_RDI);
    QStyleOption::initFrom
              ((QStyleOption *)CONCAT17(bVar7,CONCAT16(uVar6,in_stack_ffffffffffffff98)),
               (QWidget *)in_RDI);
    local_38._0_4_ = (in_RDI->dropIndicatorRect).x1;
    local_38._4_4_ = (in_RDI->dropIndicatorRect).y1;
    local_30._0_4_ = (in_RDI->dropIndicatorRect).x2;
    local_30._4_4_ = (in_RDI->dropIndicatorRect).y2;
    q_func(in_RDI);
    pQVar3 = QWidget::style(in_stack_ffffffffffffff78);
    pQVar4 = q_func(in_RDI);
    (**(code **)(*(long *)pQVar3 + 0xb0))(pQVar3,0x2b,local_48,in_RSI,pQVar4);
    QStyleOption::~QStyleOption(in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void paintDropIndicator(QPainter *painter)
    {
        if (showDropIndicator && state == QAbstractItemView::DraggingState
            && !dropIndicatorRect.isNull()
#ifndef QT_NO_CURSOR
            && viewport->cursor().shape() != Qt::ForbiddenCursor
#endif
        ) {
            QStyleOption opt;
            opt.initFrom(q_func());
            opt.rect = dropIndicatorRect;
            q_func()->style()->drawPrimitive(QStyle::PE_IndicatorItemViewItemDrop, &opt, painter, q_func());
        }
    }